

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O0

string * duckdb::CompressionExtensionFromType_abi_cxx11_(FileCompressionType type)

{
  string *msg;
  char in_SIL;
  string *in_RDI;
  allocator *this;
  allocator local_41;
  string local_40 [35];
  allocator local_1d [19];
  allocator local_a [10];
  
  if (in_SIL == '\x02') {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,".gz",local_a);
    ::std::allocator<char>::~allocator((allocator<char> *)local_a);
  }
  else {
    if (in_SIL != '\x03') {
      msg = (string *)__cxa_allocate_exception(0x10);
      this = &local_41;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_40,"Compression Extension of file compression type is not implemented",this);
      NotImplementedException::NotImplementedException((NotImplementedException *)this,msg);
      __cxa_throw(msg,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,".zst",local_1d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  return in_RDI;
}

Assistant:

string CompressionExtensionFromType(const FileCompressionType type) {
	switch (type) {
	case FileCompressionType::GZIP:
		return ".gz";
	case FileCompressionType::ZSTD:
		return ".zst";
	default:
		throw NotImplementedException("Compression Extension of file compression type is not implemented");
	}
}